

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

void __thiscall ON_ClassArray<ON_MappingRef>::Empty(ON_ClassArray<ON_MappingRef> *this)

{
  uchar *puVar1;
  undefined8 *puVar2;
  ON_MappingRef *pOVar3;
  ulong uVar4;
  long lVar5;
  
  uVar4 = (ulong)(uint)this->m_count;
  lVar5 = uVar4 * 0x28;
  while( true ) {
    if ((int)uVar4 < 1) break;
    ON_SimpleArray<ON_MappingChannel>::~ON_SimpleArray
              ((ON_SimpleArray<ON_MappingChannel> *)
               ((long)&((ON_SimpleArray<ON_MappingChannel> *)(&this->m_a[-1].m_plugin_id + 1))->
                       _vptr_ON_SimpleArray + lVar5));
    pOVar3 = this->m_a;
    *(undefined8 *)((long)(&pOVar3[-1].m_plugin_id + 2) + lVar5) = 0;
    puVar2 = (undefined8 *)
             ((long)&((ON_SimpleArray<ON_MappingChannel> *)(&pOVar3[-1].m_plugin_id + 1))->
                     _vptr_ON_SimpleArray + lVar5);
    *puVar2 = 0;
    puVar2[1] = 0;
    puVar1 = pOVar3[-1].m_plugin_id.Data4 + lVar5 + -8;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    *(undefined8 *)(puVar1 + 8) = 0;
    ON_MappingRef::ON_MappingRef((ON_MappingRef *)(this->m_a[-1].m_plugin_id.Data4 + lVar5 + -8));
    uVar4 = (ulong)((int)uVar4 - 1);
    lVar5 = lVar5 + -0x28;
  }
  this->m_count = 0;
  return;
}

Assistant:

void ON_ClassArray<T>::Empty()
{
  int i;
  for ( i = m_count-1; i >= 0; i-- ) {
    DestroyElement( m_a[i] );
    // This call to memset is ok even when T has a vtable
    // because in-place construction is used later.
    memset( (void*)(&m_a[i]), 0, sizeof(T) );
    ConstructDefaultElement( &m_a[i] );
  }
  m_count = 0;
}